

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * CompileVmFunctionContextAccess
                    (ExpressionContext *ctx,VmModule *module,ExprFunctionContextAccess *node)

{
  TypeBase *pTVar1;
  _func_int **pp_Var2;
  VariableData *source;
  SynIdentifier *pSVar3;
  char *pcVar4;
  VariableData *variable;
  VmValue *pVVar5;
  VmConstant *value;
  TypeBase *in_RCX;
  uint in_R9D;
  
  pTVar1 = node->function->contextType;
  if ((pTVar1 == (TypeBase *)0x0) || (pTVar1->typeID != 0x12)) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xe07,
                  "VmValue *CompileVmFunctionContextAccess(ExpressionContext &, VmModule *, ExprFunctionContextAccess *)"
                 );
  }
  pp_Var2 = pTVar1[1]._vptr_TypeBase;
  if ((pp_Var2 != (_func_int **)0x0) && (*(int *)(pp_Var2 + 1) == 0x18)) {
    if (pp_Var2[6] == (_func_int *)0x0) {
      value = CreateConstantPointer
                        (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                         (node->super_ExprBase).type,false);
    }
    else {
      source = node->contextVariable;
      variable = (VariableData *)
                 ExpressionContext::GetReferenceType
                           (ctx,(TypeBase *)((InplaceStr *)&source->type)->begin);
      pVVar5 = anon_unknown.dwarf_22bf96::CreateVariableAddress
                         (module,(SynBase *)source,variable,in_RCX);
      value = (VmConstant *)
              anon_unknown.dwarf_22bf96::CreateLoad
                        (ctx,module,(node->super_ExprBase).source,node->contextVariable->type,pVVar5
                         ,in_R9D);
      pSVar3 = node->contextVariable->name;
      pcVar4 = (pSVar3->name).end;
      (value->super_VmValue).comment.begin = (pSVar3->name).begin;
      (value->super_VmValue).comment.end = pcVar4;
    }
    pVVar5 = anon_unknown.dwarf_22bf96::CheckType
                       (ctx,(ExprBase *)(node->super_ExprBase).type,&value->super_VmValue);
    return pVVar5;
  }
  __assert_fail("classType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xe0b,
                "VmValue *CompileVmFunctionContextAccess(ExpressionContext &, VmModule *, ExprFunctionContextAccess *)"
               );
}

Assistant:

VmValue* CompileVmFunctionContextAccess(ExpressionContext &ctx, VmModule *module, ExprFunctionContextAccess *node)
{
	TypeRef *refType = getType<TypeRef>(node->function->contextType);

	assert(refType);

	TypeClass *classType = getType<TypeClass>(refType->subType);

	assert(classType);

	VmValue *value = NULL;

	if(classType->size == 0)
	{
		value = CreateConstantPointer(module->allocator, node->source, 0, NULL, node->type, false);
	}
	else
	{
		VmValue *address = CreateVariableAddress(module, node->source, node->contextVariable, ctx.GetReferenceType(node->contextVariable->type));

		value = CreateLoad(ctx, module, node->source, node->contextVariable->type, address, 0);

		value->comment = node->contextVariable->name->name;
	}

	return CheckType(ctx, node, value);
}